

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

void tag_nbviterbi(mdl_t *mdl,seq_t *seq,uint32_t N,uint32_t **out,double *sc,double **psc)

{
  bool bVar1;
  double *pdVar2;
  void *pvVar3;
  uint32_t y;
  uint uVar4;
  void *pvVar5;
  mdl_t *pmVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined1 *puVar14;
  uint uVar15;
  mdl_t *pmVar16;
  ulong uVar17;
  int iVar18;
  double *pdVar19;
  void *pvVar20;
  ulong uVar21;
  uint32_t uVar22;
  mdl_t *pmVar23;
  size_t size;
  double dVar24;
  undefined1 auStack_d8 [8];
  uint32_t **local_d0;
  undefined1 *local_c8;
  double *local_c0;
  void *local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  double **local_98;
  long local_90;
  void *local_88;
  long local_80;
  ulong local_78;
  void *local_70;
  double *local_68;
  mdl_t *local_60;
  mdl_t *local_58;
  void *local_50;
  seq_t *local_48;
  mdl_t *local_40;
  double *local_38;
  
  puVar14 = auStack_d8;
  uVar15 = mdl->nlbl;
  pmVar23 = (mdl_t *)(ulong)uVar15;
  uVar4 = seq->len;
  local_d0 = out;
  local_98 = psc;
  local_68 = sc;
  local_48 = seq;
  local_40 = pmVar23;
  local_38 = xvm_new((ulong)(uVar15 * uVar15 * uVar4));
  uVar21 = (ulong)N;
  local_78 = (ulong)uVar4;
  local_60 = pmVar23;
  local_50 = xmalloc((long)pmVar23 * uVar21 * (ulong)uVar4 * 4);
  size = (long)pmVar23 * uVar21 * 8;
  local_70 = xmalloc(size);
  pvVar5 = xmalloc(size);
  local_58 = mdl;
  if (mdl->type == 1) {
    tag_memmsc(mdl,local_48,local_38);
  }
  else {
    if (mdl->opt->lblpost != true) {
      tag_expsc(mdl,local_48,local_38);
      iVar18 = 0;
      bVar1 = true;
      goto LAB_001069e6;
    }
    tag_postsc(mdl,local_48,local_38);
  }
  iVar18 = 1;
  bVar1 = false;
LAB_001069e6:
  pmVar23 = local_60;
  local_40 = (mdl_t *)(ulong)((int)local_40 * N);
  if (local_58->opt->force == true) {
    tag_forced(local_58,local_48,local_38,iVar18);
  }
  uVar13 = 0;
  for (pmVar6 = (mdl_t *)0x0; pmVar6 != pmVar23; pmVar6 = (mdl_t *)((long)&pmVar6->opt + 1)) {
    *(double *)((long)local_70 + uVar13 * 8) = local_38[(long)pmVar6];
    for (uVar15 = 1; uVar7 = (ulong)((int)uVar13 + uVar15), uVar15 < N; uVar15 = uVar15 + 1) {
      *(undefined8 *)((long)local_70 + uVar7 * 8) = 0xffefffffffffffff;
    }
    uVar13 = uVar7;
  }
  local_90 = (long)pmVar23 * (long)pmVar23;
  local_a0 = (long)local_40 * 4;
  local_88 = (void *)((long)local_50 + (long)local_40 * 4);
  local_80 = (long)local_50 + (long)local_40 * 4 + 4;
  local_b0 = (long)local_40 * 8 + 0xfU & 0xfffffffffffffff0;
  uVar13 = 1;
  pdVar9 = local_38;
  pdVar19 = local_68;
  pvVar20 = local_70;
  while (uVar13 < local_78) {
    for (uVar7 = 0; local_40 != (mdl_t *)uVar7; uVar7 = uVar7 + 1) {
      *(undefined8 *)((long)pvVar5 + uVar7 * 8) = *(undefined8 *)((long)pvVar20 + uVar7 * 8);
    }
    local_c0 = pdVar9 + local_90 * uVar13;
    local_a8 = uVar13;
    local_b8 = (void *)((long)local_50 + uVar13 * (long)local_40 * 4);
    local_48 = (seq_t *)0x0;
    pmVar6 = (mdl_t *)0x0;
    while (pvVar3 = local_88, uVar13 = local_b0, pdVar2 = local_c0, pmVar6 != pmVar23) {
      local_c8 = puVar14;
      lVar11 = ((ulong)local_48 & 0xffffffff) * 4;
      lVar12 = lVar11 + local_80;
      local_58 = pmVar6;
      iVar18 = 0;
      for (pmVar16 = (mdl_t *)0x0; pvVar20 = local_b8, pmVar16 != pmVar23;
          pmVar16 = (mdl_t *)((long)&pmVar16->opt + 1)) {
        for (uVar22 = 0; N != uVar22; uVar22 = uVar22 + 1) {
          dVar24 = *(double *)((long)pvVar5 + (ulong)(iVar18 + uVar22) * 8);
          if (bVar1) {
            dVar24 = dVar24 + pdVar2[(long)((long)&pmVar6->opt + (long)pmVar16 * (long)pmVar23)];
          }
          else {
            dVar24 = dVar24 * pdVar2[(long)((long)&pmVar6->opt + (long)pmVar16 * (long)pmVar23)];
          }
          *(double *)(puVar14 + ((ulong)(iVar18 + uVar22) * 8 - uVar13)) = dVar24;
        }
        pmVar23 = local_60;
        iVar18 = iVar18 + N;
      }
      uVar15 = (int)local_58 * N;
      for (uVar7 = 0; uVar4 = N, uVar21 != uVar7; uVar7 = uVar7 + 1) {
        *(int *)((long)pvVar3 + uVar7 * 4 + lVar11) = (int)uVar7;
      }
      for (; uVar4 < (uint)local_40; uVar4 = uVar4 + 1) {
        uVar8 = 0;
        *(undefined8 *)(puVar14 + (-8 - uVar13)) = 1;
        for (uVar7 = *(ulong *)(puVar14 + (-8 - uVar13)); uVar7 < uVar21; uVar7 = uVar7 + 1) {
          uVar10 = uVar7 & 0xffffffff;
          if (*(double *)
               (puVar14 +
               ((ulong)*(uint *)((long)pvVar20 + uVar8 * 4 + (ulong)uVar15 * 4) * 8 - uVar13)) <
              *(double *)(puVar14 + ((ulong)*(uint *)(lVar12 + -4 + uVar7 * 4) * 8 - uVar13)) ||
              *(double *)
               (puVar14 +
               ((ulong)*(uint *)((long)pvVar20 + uVar8 * 4 + (ulong)uVar15 * 4) * 8 - uVar13)) ==
              *(double *)(puVar14 + ((ulong)*(uint *)(lVar12 + -4 + uVar7 * 4) * 8 - uVar13))) {
            uVar10 = uVar8;
          }
          uVar8 = uVar10;
        }
        if (*(double *)
             (puVar14 +
             ((ulong)*(uint *)((long)pvVar20 + uVar8 * 4 + (ulong)uVar15 * 4) * 8 - uVar13)) <=
            *(double *)(puVar14 + ((ulong)uVar4 * 8 - uVar13)) &&
            *(double *)(puVar14 + ((ulong)uVar4 * 8 - uVar13)) !=
            *(double *)
             (puVar14 +
             ((ulong)*(uint *)((long)pvVar20 + uVar8 * 4 + (ulong)uVar15 * 4) * 8 - uVar13))) {
          *(uint *)((long)pvVar20 + uVar8 * 4 + (ulong)uVar15 * 4) = uVar4;
        }
      }
      for (uVar7 = 0; uVar21 != uVar7; uVar7 = uVar7 + 1) {
        *(undefined8 *)((long)local_70 + (ulong)(uint)((int)local_48 + (int)uVar7) * 8) =
             *(undefined8 *)
              (puVar14 + ((ulong)*(uint *)((long)pvVar3 + uVar7 * 4 + lVar11) * 8 - uVar13));
      }
      local_48 = (seq_t *)((long)&local_48->len + uVar21);
      pdVar9 = local_38;
      puVar14 = local_c8;
      pdVar19 = local_68;
      pvVar20 = local_70;
      pmVar6 = (mdl_t *)((long)&local_58->opt + 1);
    }
    local_88 = (void *)((long)local_88 + local_a0);
    local_80 = local_80 + local_a0;
    uVar13 = local_a8 + 1;
  }
  uVar7 = 0;
  *(undefined8 *)(puVar14 + -8) = 1;
  uVar13 = *(ulong *)(puVar14 + -8);
LAB_00106c8b:
  if (uVar7 == uVar21) {
    *(undefined8 *)(puVar14 + -8) = 0x106d90;
    free(pvVar5);
    *(undefined8 *)(puVar14 + -8) = 0x106d98;
    free(pvVar20);
    pvVar5 = local_50;
    *(undefined8 *)(puVar14 + -8) = 0x106da1;
    free(pvVar5);
    xvm_free(local_38);
    return;
  }
  uVar10 = 0;
  for (uVar8 = uVar13; uVar8 < local_40; uVar8 = uVar8 + 1) {
    dVar24 = *(double *)((long)pvVar20 + uVar8 * 8);
    pdVar9 = (double *)((long)pvVar20 + uVar10 * 8);
    uVar17 = uVar8 & 0xffffffff;
    if (dVar24 < *pdVar9 || dVar24 == *pdVar9) {
      uVar17 = uVar10;
    }
    uVar10 = uVar17;
  }
  if (pdVar19 != (double *)0x0) {
    pdVar19[uVar7] = *(double *)((long)pvVar20 + uVar10 * 8);
  }
  *(undefined8 *)((long)pvVar20 + uVar10 * 8) = 0xffefffffffffffff;
  uVar8 = local_78;
  do {
    iVar18 = (int)uVar8;
    if (iVar18 == 1) {
      uVar8 = 0;
      uVar17 = 0;
    }
    else {
      if (iVar18 == 0) break;
      uVar8 = (ulong)(iVar18 - 1);
      uVar17 = (ulong)*(uint *)((long)local_50 + uVar10 * 4 + uVar8 * (long)local_40 * 4) / (ulong)N
      ;
    }
    local_d0[uVar8][uVar7] = (uint32_t)(uVar10 / N);
    if (local_98 != (double **)0x0) {
      local_98[uVar8][uVar7] = local_38[local_90 * uVar8 + uVar17 * (long)pmVar23 + uVar10 / N];
    }
    uVar10 = (ulong)*(uint *)((long)local_50 + uVar10 * 4 + uVar8 * (long)local_40 * 4);
    pvVar20 = local_70;
  } while( true );
  uVar7 = uVar7 + 1;
  pdVar19 = local_68;
  goto LAB_00106c8b;
}

Assistant:

void tag_nbviterbi(mdl_t *mdl, const seq_t *seq, uint32_t N,
                   uint32_t **out, double sc[], double **psc) {
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   *vpsi  = xvm_new(T * Y * Y);
	uint32_t *vback = xmalloc(sizeof(uint32_t) * T * Y * N);
	double   (*psi) [T][Y    ][Y] = (void *)vpsi;
	uint32_t (*back)[T][Y * N]    = (void *)vback;
	double *cur = xmalloc(sizeof(double) * Y * N);
	double *old = xmalloc(sizeof(double) * Y * N);
	// We first compute the scores for each transitions in the lattice of
	// labels.
	int op;
	if (mdl->type == 1)
		op = tag_memmsc(mdl, seq, vpsi);
	else if (mdl->opt->lblpost)
		op = tag_postsc(mdl, seq, (double *)psi);
	else
		op = tag_expsc(mdl, seq, (double *)psi);
	if (mdl->opt->force)
		tag_forced(mdl, seq, vpsi, op);
	// Here also, it's classical but we have to keep the N best paths
	// leading to each nodes of the lattice instead of only the best one.
	// This mean that code is less trivial and the current implementation is
	// not the most efficient way to do this but it works well and is good
	// enough for the moment.
	// We first build the list of all incoming arcs from all paths from all
	// N-best nodes and next select the N-best one. There is a lot of room
	// here for later optimisations if needed.
	for (uint32_t y = 0, d = 0; y < Y; y++) {
		cur[d++] = (*psi)[0][0][y];
		for (uint32_t n = 1; n < N; n++)
			cur[d++] = -DBL_MAX;
	}
	for (uint32_t t = 1; t < T; t++) {
		for (uint32_t d = 0; d < Y * N; d++)
			old[d] = cur[d];
		for (uint32_t y = 0; y < Y; y++) {
			// 1st, build the list of all incoming
			double lst[Y * N];
			for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
				for (uint32_t n = 0; n < N; n++, d++) {
					lst[d] = old[d];
					if (op)
						lst[d] *= (*psi)[t][yp][y];
					else
						lst[d] += (*psi)[t][yp][y];
				}
			}
			// 2nd, init the back with the N first
			uint32_t *bk = &(*back)[t][y * N];
			for (uint32_t n = 0; n < N; n++)
				bk[n] = n;
			// 3rd, search the N highest values
			for (uint32_t i = N; i < N * Y; i++) {
				// Search the smallest current value
				uint32_t idx = 0;
				for (uint32_t n = 1; n < N; n++)
					if (lst[bk[n]] < lst[bk[idx]])
						idx = n;
				// And replace it if needed
				if (lst[i] > lst[bk[idx]])
					bk[idx] = i;
			}
			// 4th, get the new scores
			for (uint32_t n = 0; n < N; n++)
				cur[y * N + n] = lst[bk[n]];
		}
	}
	// Retrieving the best paths is similar to classical Viterbi except that
	// we have to search for the N bet ones and there is N time more
	// possibles starts.
	for (uint32_t n = 0; n < N; n++) {
		uint32_t bst = 0;
		for (uint32_t d = 1; d < Y * N; d++)
			if (cur[d] > cur[bst])
				bst = d;
		if (sc != NULL)
			sc[n] = cur[bst];
		cur[bst] = -DBL_MAX;
		for (uint32_t t = T; t > 0; t--) {
			const uint32_t yp = (t != 1) ? (*back)[t - 1][bst] / N: 0;
			const uint32_t y  = bst / N;
			out[t - 1][n] = y;
			if (psc != NULL)
				psc[t - 1][n] = (*psi)[t - 1][yp][y];
			bst = (*back)[t - 1][bst];
		}
	}
	free(old);
	free(cur);
	free(vback);
	xvm_free(vpsi);
}